

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

Expression *
wasm::Bits::makePackedFieldGet(Expression *value,Field *field,bool signed_,Module *wasm)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Expression *pEVar4;
  Const *right;
  Builder local_30;
  Builder builder;
  
  bVar1 = Field::isPacked(field);
  if (bVar1) {
    if (signed_) {
      uVar2 = Field::getByteSize(field);
      pEVar4 = makeSignExt(value,uVar2,wasm);
      return pEVar4;
    }
    local_30.wasm = wasm;
    uVar3 = Field::getByteSize(field);
    uVar2 = 0xffffffff >> (-(char)(uVar3 * 8) & 0x1fU);
    if (0x1f < (int)(uVar3 * 8)) {
      uVar2 = 0xffffffff;
    }
    right = Builder::makeConst<int>(&local_30,uVar2);
    value = (Expression *)Builder::makeBinary(&local_30,AndInt32,value,(Expression *)right);
  }
  return (Expression *)(Binary *)value;
}

Assistant:

inline Expression* makePackedFieldGet(Expression* value,
                                      const Field& field,
                                      bool signed_,
                                      Module& wasm) {
  if (!field.isPacked()) {
    return value;
  }

  if (signed_) {
    return makeSignExt(value, field.getByteSize(), wasm);
  }

  Builder builder(wasm);
  auto mask = Bits::lowBitMask(field.getByteSize() * 8);
  return builder.makeBinary(AndInt32, value, builder.makeConst(int32_t(mask)));
}